

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O3

Vec_Int_t * Abc_NtkCollectCiCones(Abc_Ntk_t *pNtk,int fVerbose)

{
  long lVar1;
  uint uVar2;
  void *__ptr;
  int iVar3;
  uint uVar4;
  Vec_Ptr_t *__ptr_00;
  Vec_Int_t *vArr;
  int *piVar5;
  uint *__ptr_01;
  void *pvVar6;
  int iVar7;
  long lVar8;
  Vec_Int_t *p;
  Vec_Ptr_t *pVVar9;
  long lVar10;
  timespec ts;
  timespec local_88;
  long local_70;
  Vec_Int_t *local_68;
  int local_5c;
  ulong local_58;
  void *local_50;
  Vec_Ptr_t *local_48;
  long local_40;
  long local_38;
  
  local_5c = fVerbose;
  iVar3 = clock_gettime(3,&local_88);
  if (iVar3 < 0) {
    local_70 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
    local_70 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_88.tv_sec * -1000000;
  }
  piVar5 = (int *)0x0;
  __ptr_00 = Abc_NtkDfs(pNtk,0);
  vArr = (Vec_Int_t *)calloc(1,0x10);
  pVVar9 = pNtk->vCis;
  iVar3 = pVVar9->nSize;
  local_68 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar7 = iVar3;
  }
  local_68->nSize = 0;
  local_68->nCap = iVar7;
  if (iVar7 != 0) {
    piVar5 = (int *)malloc((long)iVar7 << 2);
  }
  local_68->pArray = piVar5;
  uVar2 = pNtk->vObjs->nSize;
  __ptr_01 = (uint *)malloc(0x10);
  uVar4 = 8;
  if (6 < uVar2 - 1) {
    uVar4 = uVar2;
  }
  *__ptr_01 = uVar4;
  local_58 = (ulong)uVar2;
  if (uVar4 == 0) {
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar6 = calloc((long)(int)uVar4,0x10);
  }
  *(void **)(__ptr_01 + 2) = pvVar6;
  __ptr_01[1] = (uint)local_58;
  lVar8 = (long)__ptr_00->nSize;
  if (0 < lVar8) {
    do {
      local_48 = __ptr_00;
      local_50 = pvVar6;
      if (local_48->nSize < lVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      lVar1 = lVar8 + -1;
      pvVar6 = local_48->pArray[lVar1];
      iVar3 = *(int *)((long)pvVar6 + 0x10);
      local_38 = lVar8;
      if (((long)iVar3 < 0) || ((int)local_58 <= iVar3)) goto LAB_0028d8ed;
      p = (Vec_Int_t *)((long)iVar3 * 0x10 + (long)local_50);
      local_40 = lVar1;
      Vec_IntPush(p,(int)lVar1);
      if (0 < *(int *)((long)pvVar6 + 0x1c)) {
        lVar8 = 0;
        do {
          iVar3 = *(int *)(*(long *)((long)pvVar6 + 0x20) + lVar8 * 4);
          if (((long)iVar3 < 0) || ((int)__ptr_01[1] <= iVar3)) goto LAB_0028d8ed;
          lVar1 = *(long *)(__ptr_01 + 2);
          lVar10 = (long)iVar3 * 0x10;
          Vec_IntTwoMerge2((Vec_Int_t *)(lVar10 + lVar1),p,vArr);
          local_88.tv_sec = *(long *)(lVar1 + lVar10);
          local_88.tv_nsec = ((long *)(lVar1 + lVar10))[1];
          piVar5 = vArr->pArray;
          *(undefined8 *)(lVar1 + lVar10) = *(undefined8 *)vArr;
          ((undefined8 *)(lVar1 + lVar10))[1] = piVar5;
          vArr->nCap = (int)local_88.tv_sec;
          vArr->nSize = (int)((ulong)local_88.tv_sec >> 0x20);
          vArr->pArray = (int *)local_88.tv_nsec;
          lVar8 = lVar8 + 1;
        } while (lVar8 < *(int *)((long)pvVar6 + 0x1c));
      }
      lVar8 = local_40;
      pvVar6 = local_50;
      __ptr_00 = local_48;
    } while (1 < local_38);
    pVVar9 = pNtk->vCis;
    iVar3 = pVVar9->nSize;
  }
  if (iVar3 < 1) {
    pvVar6 = *(void **)(__ptr_01 + 2);
  }
  else {
    lVar8 = 0;
    do {
      iVar3 = *(int *)((long)pVVar9->pArray[lVar8] + 0x10);
      if (((long)iVar3 < 0) || ((int)__ptr_01[1] <= iVar3)) {
LAB_0028d8ed:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pvVar6 = *(void **)(__ptr_01 + 2);
      Vec_IntPush(local_68,*(int *)((long)pvVar6 + (long)iVar3 * 0x10 + 4));
      lVar8 = lVar8 + 1;
      pVVar9 = pNtk->vCis;
    } while (lVar8 < pVVar9->nSize);
  }
  uVar2 = *__ptr_01;
  if ((long)(int)uVar2 < 1) {
    if (pvVar6 == (void *)0x0) goto LAB_0028d816;
  }
  else {
    lVar8 = 0;
    do {
      __ptr = *(void **)((long)pvVar6 + lVar8 + 8);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)pvVar6 + lVar8 + 8) = 0;
      }
      lVar8 = lVar8 + 0x10;
    } while ((long)(int)uVar2 * 0x10 != lVar8);
  }
  free(pvVar6);
LAB_0028d816:
  free(__ptr_01);
  if (__ptr_00->pArray != (void **)0x0) {
    free(__ptr_00->pArray);
  }
  free(__ptr_00);
  if (vArr->pArray != (int *)0x0) {
    free(vArr->pArray);
  }
  free(vArr);
  if (local_5c != 0) {
    iVar7 = 3;
    iVar3 = clock_gettime(3,&local_88);
    if (iVar3 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
    }
    lVar8 = lVar8 + local_70;
    Abc_Print(iVar7,"%s =","Output cone computation");
    Abc_Print(iVar7,"%9.2f sec\n",SUB84((double)lVar8 / 1000000.0,0));
  }
  return local_68;
}

Assistant:

Vec_Int_t * Abc_NtkCollectCiCones( Abc_Ntk_t * pNtk, int fVerbose )
{
    abctime clk = Abc_Clock();
    Abc_Obj_t * pNode; int i, k;
    Vec_Ptr_t * vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_Int_t * vFanin, * vFanout, * vTemp = Vec_IntAlloc( 0 );
    Vec_Int_t * vSuppsCi = Vec_IntAlloc( Abc_NtkCiNum(pNtk) );
    Vec_Wec_t * vSupps = Vec_WecStart( Abc_NtkObjNumMax(pNtk) );
    Vec_PtrForEachEntryReverse( Abc_Obj_t *, vNodes, pNode, i )
    {
        vFanout = Vec_WecEntry(vSupps, Abc_ObjId(pNode));
        Vec_IntPush( vFanout, i );
        for ( k = 0; k < Abc_ObjFaninNum(pNode); k++ )
        {
            vFanin = Vec_WecEntry(vSupps, Abc_ObjFaninId(pNode, k));
            Vec_IntTwoMerge2( vFanin, vFanout, vTemp );
            ABC_SWAP( Vec_Int_t, *vFanin, *vTemp );
        }
    }
    Abc_NtkForEachCi( pNtk, pNode, i )
        Vec_IntPush( vSuppsCi, Vec_IntSize(Vec_WecEntry(vSupps, Abc_ObjId(pNode))) );
    Vec_WecFree( vSupps );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vTemp );
    if ( fVerbose )
        Abc_PrintTime( 1, "Output cone computation", Abc_Clock() - clk );
    //Vec_IntPrint( vSuppsCi );
    return vSuppsCi;
}